

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

uint32 google::protobuf::Bits::Log2FloorNonZero(uint32 n)

{
  uint32 uVar1;
  uint32 n_local;
  
  uVar1 = 0x1f;
  if (n != 0) {
    for (; n >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return uVar1;
}

Assistant:

static uint32 Log2FloorNonZero(uint32 n) {
#if defined(__GNUC__)
  return 31 ^ static_cast<uint32>(__builtin_clz(n));
#elif defined(_MSC_VER)
  unsigned long where;
  _BitScanReverse(&where, n);
  return where;
#else
  return Log2FloorNonZero_Portable(n);
#endif
  }